

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

void __thiscall mjs::anon_unknown_46::json_lexer::~json_lexer(json_lexer *this)

{
  std::__cxx11::wstring::~wstring((wstring *)&(this->tok_).text_);
  std::__cxx11::wstring::~wstring((wstring *)&this->text_);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this);
  return;
}

Assistant:

explicit json_lexer(const gc_heap_ptr<global_object>& global, std::wstring&& text)
        : global_{global}
        , text_{std::move(text)}
        , pos_{0}
        , tok_{json_token_type::eof, 0} {
        next_token();
    }